

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall
iu_AssertionTest_x_iutest_x_STRIN_Test::Body(iu_AssertionTest_x_iutest_x_STRIN_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionResult iutest_ar;
  char test [5];
  string str;
  AssertionResult local_218;
  char local_1f0 [4];
  char local_1ec;
  iuCodeMessage local_1e8;
  string local_1b8 [32];
  Fixed local_198;
  
  local_1ec = '\0';
  builtin_strncpy(local_1f0,"test",4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,local_1f0,(allocator<char> *)&local_198);
  iuutil::StrInHelper::Assertion<char[4],char[5]>
            (&local_218,(StrInHelper *)"\"tes\"","test","tes",&local_1f0,(char (*) [5])in_R9);
  if (local_218.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
               ,0x13a,local_218.m_message._M_dataplus._M_p);
    local_1e8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
  }
  else {
    std::__cxx11::string::~string((string *)&local_218);
    iuutil::StrInHelper::Assertion<char[4],char[5]>
              (&local_218,(StrInHelper *)"\"tes\"","test","tes",&local_1f0,(char (*) [5])in_R9);
    if (local_218.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                 ,0x13b,local_218.m_message._M_dataplus._M_p);
      local_1e8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
      std::__cxx11::string::~string((string *)&local_1e8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&local_218);
    iuutil::StrInHelper::Assertion<char[4],char[5]>
              (&local_218,(StrInHelper *)"\"tes\"","test","tes",&local_1f0,(char (*) [5])in_R9);
    if (local_218.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                 ,0x13c,local_218.m_message._M_dataplus._M_p);
      local_1e8._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
      std::__cxx11::string::~string((string *)&local_1e8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
    }
    std::__cxx11::string::~string((string *)&local_218);
    iuutil::StrInHelper::Assertion<char[4],char[5]>
              (&local_218,(StrInHelper *)"\"tes\"","test","tes",&local_1f0,(char (*) [5])in_R9);
    if (local_218.m_result == false) {
      memset(&local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_198);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                 ,0x13d,local_218.m_message._M_dataplus._M_p);
      local_1e8._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
    }
    else {
      std::__cxx11::string::~string((string *)&local_218);
      iuutil::StrInHelper::Assertion<char[5],char[5]>
                (&local_218,(StrInHelper *)"\"test\"","test","test",(char (*) [5])local_1f0,
                 (char (*) [5])in_R9);
      if (local_218.m_result == false) {
        memset(&local_198,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)&local_198);
        iutest::detail::iuCodeMessage::iuCodeMessage
                  (&local_1e8,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                   ,0x13f,local_218.m_message._M_dataplus._M_p);
        local_1e8._44_4_ = 2;
        iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
      }
      else {
        std::__cxx11::string::~string((string *)&local_218);
        iuutil::StrInHelper::Assertion<char[5],char[5]>
                  (&local_218,(StrInHelper *)"\"test\"","test","test",(char (*) [5])local_1f0,
                   (char (*) [5])in_R9);
        if (local_218.m_result == false) {
          memset(&local_198,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&local_198);
          iutest::detail::iuCodeMessage::iuCodeMessage
                    (&local_1e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                     ,0x140,local_218.m_message._M_dataplus._M_p);
          local_1e8._44_4_ = 1;
          iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
          std::__cxx11::string::~string((string *)&local_1e8);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&local_198);
        }
        std::__cxx11::string::~string((string *)&local_218);
        iuutil::StrInHelper::Assertion<char[5],char[5]>
                  (&local_218,(StrInHelper *)"\"test\"","test","test",(char (*) [5])local_1f0,
                   (char (*) [5])in_R9);
        if (local_218.m_result == false) {
          memset(&local_198,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&local_198);
          iutest::detail::iuCodeMessage::iuCodeMessage
                    (&local_1e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                     ,0x141,local_218.m_message._M_dataplus._M_p);
          local_1e8._44_4_ = 0xffffffff;
          iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
          std::__cxx11::string::~string((string *)&local_1e8);
          iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&local_198);
        }
        std::__cxx11::string::~string((string *)&local_218);
        iuutil::StrInHelper::Assertion<char[5],char[5]>
                  (&local_218,(StrInHelper *)"\"test\"","test","test",(char (*) [5])local_1f0,
                   (char (*) [5])in_R9);
        if (local_218.m_result == false) {
          memset(&local_198,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)&local_198);
          iutest::detail::iuCodeMessage::iuCodeMessage
                    (&local_1e8,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                     ,0x142,local_218.m_message._M_dataplus._M_p);
          local_1e8._44_4_ = 0xfffffffd;
          iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
        }
        else {
          std::__cxx11::string::~string((string *)&local_218);
          iuutil::StrInHelper::Assertion<char[4],std::__cxx11::string>
                    (&local_218,(StrInHelper *)"\"tes\"","str","tes",(char (*) [4])local_1b8,in_R9);
          if (local_218.m_result == false) {
            memset(&local_198,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)&local_198);
            iutest::detail::iuCodeMessage::iuCodeMessage
                      (&local_1e8,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                       ,0x144,local_218.m_message._M_dataplus._M_p);
            local_1e8._44_4_ = 2;
            iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
          }
          else {
            std::__cxx11::string::~string((string *)&local_218);
            iuutil::StrInHelper::Assertion<char[4],std::__cxx11::string>
                      (&local_218,(StrInHelper *)"\"tes\"","str","tes",(char (*) [4])local_1b8,in_R9
                      );
            if (local_218.m_result == false) {
              memset(&local_198,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&local_198);
              iutest::detail::iuCodeMessage::iuCodeMessage
                        (&local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                         ,0x145,local_218.m_message._M_dataplus._M_p);
              local_1e8._44_4_ = 1;
              iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
              std::__cxx11::string::~string((string *)&local_1e8);
              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&local_198);
            }
            std::__cxx11::string::~string((string *)&local_218);
            iuutil::StrInHelper::Assertion<char[4],std::__cxx11::string>
                      (&local_218,(StrInHelper *)"\"tes\"","str","tes",(char (*) [4])local_1b8,in_R9
                      );
            if (local_218.m_result == false) {
              memset(&local_198,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&local_198);
              iutest::detail::iuCodeMessage::iuCodeMessage
                        (&local_1e8,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                         ,0x146,local_218.m_message._M_dataplus._M_p);
              local_1e8._44_4_ = 0xffffffff;
              iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
              std::__cxx11::string::~string((string *)&local_1e8);
              iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                        ((iu_global_format_stringstream *)&local_198);
            }
            std::__cxx11::string::~string((string *)&local_218);
            iuutil::StrInHelper::Assertion<char[4],std::__cxx11::string>
                      (&local_218,(StrInHelper *)"\"tes\"","str","tes",(char (*) [4])local_1b8,in_R9
                      );
            if (local_218.m_result != false) goto LAB_00146b95;
            memset(&local_198,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)&local_198);
            iutest::detail::iuCodeMessage::iuCodeMessage
                      (&local_1e8,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp"
                       ,0x147,local_218.m_message._M_dataplus._M_p);
            local_1e8._44_4_ = 0xfffffffd;
            iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,&local_198);
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_1e8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
LAB_00146b95:
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string(local_1b8);
  return;
}

Assistant:

IUTEST(AssertionTest, STRIN)
{
    const char test[] = "test";
    ::std::string str = test;
    IUTEST_ASSERT_STRIN("tes", test);
    IUTEST_EXPECT_STRIN("tes", test);
    IUTEST_INFORM_STRIN("tes", test);
    IUTEST_ASSUME_STRIN("tes", test);

    IUTEST_ASSERT_STRIN("test", test);
    IUTEST_EXPECT_STRIN("test", test);
    IUTEST_INFORM_STRIN("test", test);
    IUTEST_ASSUME_STRIN("test", test);

    IUTEST_ASSERT_STRIN("tes", str);
    IUTEST_EXPECT_STRIN("tes", str);
    IUTEST_INFORM_STRIN("tes", str);
    IUTEST_ASSUME_STRIN("tes", str);
}